

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int op_update(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *s;
  int *s_00;
  char *key;
  lua_Integer lVar5;
  long lVar6;
  size_t sz;
  buffer buf;
  luaL_Buffer b;
  
  s = (int *)lua_touserdata(L,3);
  s_00 = (int *)lua_touserdata(L,4);
  if (s_00 == (int *)0x0 || s == (int *)0x0) {
    luaL_error(L,"Invalid param");
  }
  sz = 0;
  key = luaL_checklstring(L,1,&sz);
  luaL_buffinit(L,&b);
  buf.ptr = buf.buffer;
  buf.size = 0;
  buf.cap = 0x80;
  iVar3 = reserve_length(&buf);
  write_int32(&buf,0);
  write_int32(&buf,0);
  write_int32(&buf,0x7d1);
  write_int32(&buf,0);
  write_string(&buf,key,sz);
  lVar5 = lua_tointegerx(L,2,(int *)0x0);
  write_int32(&buf,(int32_t)lVar5);
  iVar1 = *s;
  iVar2 = *s_00;
  iVar4 = iVar2 + iVar1 + buf.size;
  lVar6 = (long)iVar3;
  buf.ptr[lVar6] = (uint8_t)iVar4;
  buf.ptr[lVar6 + 1] = (uint8_t)((uint)iVar4 >> 8);
  buf.ptr[lVar6 + 2] = (uint8_t)((uint)iVar4 >> 0x10);
  buf.ptr[lVar6 + 3] = (uint8_t)((uint)iVar4 >> 0x18);
  luaL_addlstring(&b,(char *)buf.ptr,(long)buf.size);
  buffer_destroy(&buf);
  luaL_addlstring(&b,(char *)s,(long)iVar1);
  luaL_addlstring(&b,(char *)s_00,(long)iVar2);
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int
op_update(lua_State *L) {
	document selector  = lua_touserdata(L,3);
	document update = lua_touserdata(L,4);
	if (selector == NULL || update == NULL) {
		luaL_error(L, "Invalid param");
	}
	size_t sz = 0;
	const char * name = luaL_checklstring(L,1,&sz);

	luaL_Buffer b;
	luaL_buffinit(L, &b);

	struct buffer buf;
	buffer_create(&buf);
		// make package header, don't raise L error
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_UPDATE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, lua_tointeger(L,2));

		int32_t selector_len = get_length(selector);
		int32_t update_len = get_length(update);

		int total = buf.size + selector_len + update_len;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	luaL_addlstring(&b, (const char *)selector, selector_len);
	luaL_addlstring(&b, (const char *)update, update_len);

	luaL_pushresult(&b);

	return 1;
}